

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::GeneratedCodeInfo::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  GeneratedCodeInfo **v1;
  GeneratedCodeInfo **v2;
  char *failure_msg;
  LogMessage *pLVar1;
  RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *this;
  RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation> *other;
  uint32_t cached_has_bits;
  LogMessage local_50;
  Voidify local_39;
  GeneratedCodeInfo *local_38;
  Nullable<const_char_*> local_30;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  GeneratedCodeInfo *from;
  GeneratedCodeInfo *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (GeneratedCodeInfo *)from_msg;
  absl_log_internal_check_op_result = (Nullable<const_char_*>)from_msg;
  from = (GeneratedCodeInfo *)to_msg;
  _this = (GeneratedCodeInfo *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::GeneratedCodeInfo_const*>(&local_38);
  v2 = absl::lts_20250127::log_internal::GetReferenceableValue<google::protobuf::GeneratedCodeInfo*>
                 (&from);
  local_30 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::GeneratedCodeInfo_const*,google::protobuf::GeneratedCodeInfo*>
                       (v1,v2,"&from != _this");
  if (local_30 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_30);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x3d5a,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_39,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  this = _internal_mutable_annotation(from);
  other = _internal_annotation((GeneratedCodeInfo *)absl_log_internal_check_op_result);
  RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::MergeFrom(this,other);
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)(absl_log_internal_check_op_result + 8));
  return;
}

Assistant:

void GeneratedCodeInfo::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<GeneratedCodeInfo*>(&to_msg);
  auto& from = static_cast<const GeneratedCodeInfo&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.GeneratedCodeInfo)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_annotation()->MergeFrom(
      from._internal_annotation());
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}